

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

int read_dns_answers(answer *answers,char *message)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  ulong in_RAX;
  ushort uVar4;
  uint uVar5;
  ulong uVar6;
  char *src;
  _Bool good;
  undefined8 uStack_38;
  
  uVar4 = *(ushort *)(message + 4);
  uVar1 = *(ushort *)(message + 6);
  src = message + 0xc;
  if (uVar4 != 0) {
    uVar4 = uVar4 << 8 | uVar4 >> 8;
    uVar3 = 1;
    if (1 < uVar4) {
      uVar3 = (uint)uVar4;
    }
    uVar5 = 0;
    do {
      for (; *src != '\0'; src = src + (long)*src + 1) {
      }
      src = src + 5;
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar3);
  }
  uStack_38 = in_RAX & 0xffffffffffffff;
  if (uVar1 == 0) {
    uVar3 = 0;
  }
  else {
    uVar1 = uVar1 << 8 | uVar1 >> 8;
    uVar4 = 1;
    if (1 < uVar1) {
      uVar4 = uVar1;
    }
    uVar5 = (uint)uVar4;
    uVar6 = 0;
    do {
      uStack_38 = uStack_38 & 0xffffffffffffff;
      iVar2 = read_dns_answer(answers + uVar6,src,message,(_Bool *)((long)&uStack_38 + 7));
      src = src + iVar2;
      uVar3 = (uint)uStack_38._7_1_ + (int)uVar6;
      uVar6 = (ulong)uVar3;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  return uVar3;
}

Assistant:

int read_dns_answers(struct answer *answers, char *message) {
  //读取报文中所有回答
  struct dns_header *header;
  struct answer_struct *answer_struct;
  header = (struct dns_header *)message;
  unsigned short ans = ntohs(header->ancount);
  unsigned short question = ntohs(header->qdcount);
  char *data = message + DNS_HEADER_SIZE;
      // printf("");fflush(stdout);

  for (int i = 0; i < question; i++) {
    while ((*data) != 0)
      data += (*data) + 1;
    data += 5;
  }
  bool good = false;
  int cnt = 0;
  for (int i = 0; i < ans && data != 0; i++) {
    good = false;
    data +=  read_dns_answer((struct answer *)&answers[cnt], data, message,&good);
    if(good){
      cnt++;
    }
  }
  
  return cnt;
}